

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  uint uVar4;
  srv_role sVar5;
  element_type *peVar6;
  element_type *peVar7;
  ulong uVar8;
  element_type *peVar9;
  undefined8 uVar10;
  ulong uVar11;
  element_type *peVar12;
  ulong uVar13;
  element_type *peVar14;
  char *pcVar15;
  resp_msg *in_RSI;
  long in_RDI;
  lock_guard<std::mutex> guard_1;
  bool snp_install_done;
  ptr<snapshot> snp;
  ptr<peer> *in_stack_00000280;
  raft_server *in_stack_00000288;
  ptr<snapshot_sync_ctx> sync_ctx;
  lock_guard<std::mutex> guard;
  ptr<peer> p;
  bool need_to_catchup;
  peer_itor it;
  resp_msg *in_stack_fffffffffffffcb8;
  peer *in_stack_fffffffffffffcc0;
  peer *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  raft_server *in_stack_fffffffffffffd50;
  bool local_29a;
  bool local_25b;
  bool local_259;
  shared_ptr<nuraft::peer> local_1b8;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [39];
  byte local_119;
  __shared_ptr local_118 [23];
  undefined1 local_101;
  string local_100 [48];
  string local_d0 [79];
  bool local_81;
  string local_80 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_60;
  int32 local_54;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48 [3];
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1af860);
    iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
    if (4 < iVar3) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1af886);
      bVar1 = resp_msg::get_accepted(local_10);
      pcVar15 = "not accepted";
      if (bVar1) {
        pcVar15 = "accepted";
      }
      msg_if_given_abi_cxx11_((char *)local_30,"%s\n",pcVar15);
      (**(code **)(*(long *)peVar9 + 0x40))
                (peVar9,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x148,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  local_54 = msg_base::get_src(&local_10->super_msg_base);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               *)in_stack_fffffffffffffcb8,(key_type *)0x1af977);
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffffcc0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             in_stack_fffffffffffffcb8);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
              *)in_stack_fffffffffffffcb8);
  bVar1 = std::__detail::operator==(local_48,&local_60);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (!bVar1) {
      return;
    }
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1af9ff);
    iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
    if (iVar3 < 4) {
      return;
    }
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afa25);
    uVar4 = msg_base::get_src(&local_10->super_msg_base);
    msg_if_given_abi_cxx11_((char *)local_80,"the response is from an unknown peer %d",(ulong)uVar4)
    ;
    (**(code **)(*(long *)peVar9 + 0x40))
              (peVar9,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x14b,local_80);
    std::__cxx11::string::~string(local_80);
    return;
  }
  local_81 = true;
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)0x1afadd);
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffcc0,
             (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffcb8);
  bVar1 = resp_msg::get_accepted(local_10);
  if (!bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b057b);
      iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
      if (2 < iVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b05ae);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b05c0);
        uVar4 = peer::get_id((peer *)0x1b05c8);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b05db);
        uVar11 = peer::get_next_log_idx((peer *)0x1b05e3);
        peVar12 = std::
                  __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b05fe);
        uVar10 = (**(code **)(*(long *)peVar12 + 0x10))();
        msg_if_given_abi_cxx11_
                  ((char *)local_1a0,
                   "peer %d declined snapshot: p->get_next_log_idx(): %lu, log_store_->next_slot(): %lu"
                   ,(ulong)uVar4,uVar11,uVar10);
        (**(code **)(*(long *)peVar9 + 0x40))
                  (peVar9,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x17d,local_1a0);
        std::__cxx11::string::~string(local_1a0);
      }
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b06aa);
    resp_msg::get_next_idx(local_10);
    peer::set_next_log_idx(in_stack_fffffffffffffcc0,(ulong)in_stack_fffffffffffffcb8);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b06e1);
    uVar11 = peer::get_next_log_idx((peer *)0x1b06e9);
    peVar12 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b0704);
    uVar13 = (**(code **)(*(long *)peVar12 + 0x10))();
    local_81 = uVar11 < uVar13;
    peVar14 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b0739);
    in_stack_fffffffffffffcc0 = (peer *)peer::get_lock(peVar14);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffcc0,
               (mutex_type *)in_stack_fffffffffffffcb8);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffcc0);
    clear_snapshot_sync_ctx
              (in_stack_fffffffffffffd50,
               (peer *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b0788);
    goto LAB_001b07b0;
  }
  peVar14 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1afb24);
  peer::get_lock(peVar14);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffcc0,
             (mutex_type *)in_stack_fffffffffffffcb8);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1afb5a
            );
  peer::get_snapshot_sync_ctx(in_stack_fffffffffffffcd8);
  bVar1 = std::operator==((shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffcc0,
                          in_stack_fffffffffffffcb8);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1afbb7);
      iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
      if (3 < iVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1afbf0);
        msg_if_given_abi_cxx11_
                  ((char *)local_d0,"no snapshot sync context for this peer, drop the response");
        (**(code **)(*(long *)peVar9 + 0x40))
                  (peVar9,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x157,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
    }
    local_81 = false;
  }
  else {
    peVar6 = std::
             __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1afcde);
    snapshot_sync_ctx::get_snapshot(peVar6);
    std::shared_ptr<nuraft::snapshot>::shared_ptr
              ((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffcc0,
               (shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffcb8);
    peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afd1a);
    tVar2 = snapshot::get_type(peVar7);
    if ((tVar2 == raw_binary) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)), bVar1))
    {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1afd6f);
      iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
      if (4 < iVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1afda8);
        uVar11 = resp_msg::get_next_idx(local_10);
        peVar7 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1afdd4);
        uVar8 = snapshot::size(peVar7);
        msg_if_given_abi_cxx11_
                  ((char *)local_100,"resp.get_next_idx(): %lu, snp->size(): %lu",uVar11,uVar8);
        (**(code **)(*(long *)peVar9 + 0x40))
                  (peVar9,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x15f,local_100);
        std::__cxx11::string::~string(local_100);
      }
    }
    peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afe9f);
    local_119 = 0;
    tVar2 = snapshot::get_type(peVar7);
    if (tVar2 == raw_binary) {
      uVar11 = resp_msg::get_next_idx(local_10);
      peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1afeeb);
      uVar8 = snapshot::size(peVar7);
      local_259 = true;
      if (uVar11 < uVar8) goto LAB_001aff1b;
    }
    else {
LAB_001aff1b:
      peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1aff28);
      tVar2 = snapshot::get_type(peVar7);
      local_25b = false;
      if (tVar2 == logical_object) {
        resp_msg::get_ctx(in_stack_fffffffffffffcb8);
        local_119 = 1;
        local_25b = std::__shared_ptr::operator_cast_to_bool(local_118);
      }
      local_259 = local_25b;
    }
    if ((local_119 & 1) != 0) {
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1affb9);
    }
    local_101 = local_259;
    if (local_259 == false) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b03e9);
        iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (4 < iVar3) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b041c);
          uVar11 = resp_msg::get_next_idx(local_10);
          msg_if_given_abi_cxx11_
                    ((char *)local_180,"continue to sync snapshot at offset %lu",uVar11);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x175,local_180);
          std::__cxx11::string::~string(local_180);
        }
      }
      std::__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b04c2);
      resp_msg::get_next_idx(local_10);
      snapshot_sync_ctx::set_offset
                ((snapshot_sync_ctx *)in_stack_fffffffffffffcc0,(ulong)in_stack_fffffffffffffcb8);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b0008);
        iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (4 < iVar3) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b0041);
          msg_if_given_abi_cxx11_((char *)local_140,"snapshot sync is done (raw type)");
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x16a,local_140);
          std::__cxx11::string::~string(local_140);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b00d7);
      peVar6 = std::
               __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b00ec);
      snapshot_sync_ctx::get_snapshot(peVar6);
      peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b010b);
      snapshot::get_last_log_idx(peVar7);
      peer::set_next_log_idx(in_stack_fffffffffffffcc0,(ulong)in_stack_fffffffffffffcb8);
      peVar14 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b0144);
      peVar6 = std::
               __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b0159);
      snapshot_sync_ctx::get_snapshot(peVar6);
      peVar7 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b0178);
      uVar11 = snapshot::get_last_log_idx(peVar7);
      peer::set_matched_idx(peVar14,uVar11);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffcc0);
      clear_snapshot_sync_ctx
                (in_stack_fffffffffffffd50,
                 (peer *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b01cd);
      bVar1 = peer::clear_pending_commit(in_stack_fffffffffffffcc0);
      local_29a = true;
      if (!bVar1) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b0202);
        uVar11 = peer::get_next_log_idx((peer *)0x1b020a);
        peVar12 = std::
                  __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b0228);
        uVar13 = (**(code **)(*(long *)peVar12 + 0x10))();
        local_29a = uVar11 < uVar13;
      }
      local_81 = local_29a;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b029c);
        iVar3 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (3 < iVar3) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b02d5);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1b02ea);
          uVar11 = peer::get_next_log_idx((peer *)0x1b02f2);
          peVar14 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1b0309);
          uVar8 = peer::get_matched_idx(peVar14);
          msg_if_given_abi_cxx11_
                    ((char *)local_160,"snapshot done %lu, %lu, %d",uVar11,uVar8,
                     (ulong)(local_81 & 1));
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x172,local_160);
          std::__cxx11::string::~string(local_160);
        }
      }
    }
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1b04fb);
  }
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x1b0519);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b0526);
LAB_001b07b0:
  sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1b07c4);
  if ((sVar5 == leader) && ((local_81 & 1U) != 0)) {
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffcc0,&local_1b8);
    request_append_entries(in_stack_00000288,in_stack_00000280);
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1b080c);
  }
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1b083e);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp) {
    p_db("%s\n", resp.get_accepted() ? "accepted" : "not accepted");
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted()) {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nullptr) {
            p_in("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;

        } else {
            ptr<snapshot> snp = sync_ctx->get_snapshot();
            if (snp->get_type() == snapshot::raw_binary) {
                // LCOV_EXCL_START
                p_db("resp.get_next_idx(): %" PRIu64 ", snp->size(): %" PRIu64,
                     resp.get_next_idx(), snp->size());
                // LCOV_EXCL_STOP
            }

            bool snp_install_done =
                 ( snp->get_type() == snapshot::raw_binary &&
                   resp.get_next_idx() >= snp->size() )           ||
                 ( snp->get_type() == snapshot::logical_object &&
                   resp.get_ctx() );

            if (snp_install_done) {
                p_db("snapshot sync is done (raw type)");
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                clear_snapshot_sync_ctx(*p);

                need_to_catchup = p->clear_pending_commit() ||
                                  p->get_next_log_idx() < log_store_->next_slot();
                p_in("snapshot done %" PRIu64 ", %" PRIu64 ", %d",
                     p->get_next_log_idx(), p->get_matched_idx(), need_to_catchup);
            } else {
                p_db("continue to sync snapshot at offset %" PRIu64,
                     resp.get_next_idx());
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }

    } else {
        p_wn( "peer %d declined snapshot: p->get_next_log_idx(): %" PRIu64 ", "
              "log_store_->next_slot(): %" PRIu64,
              p->get_id(), p->get_next_log_idx(), log_store_->next_slot() );
        p->set_next_log_idx(resp.get_next_idx());

        // Added by Jung-Sang Ahn (Oct 11 2017)
        // Declining snapshot implies that the peer already has the up-to-date snapshot.
        need_to_catchup = p->get_next_log_idx() < log_store_->next_slot();

        // Should reset current snapshot context,
        // to continue with more recent snapshot.
        std::lock_guard<std::mutex> guard(p->get_lock());
        clear_snapshot_sync_ctx(*p);
    }

    // This may not be a leader anymore, such as
    // the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup) {
        request_append_entries(p);
    }
}